

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

RegOpnd * __thiscall IR::Opnd::FindRegUse(Opnd *this,RegOpnd *regOpnd)

{
  StackSym *pSVar1;
  RegOpnd *pRVar2;
  IndirOpnd *pIVar3;
  
  pSVar1 = regOpnd->m_sym;
  if (this->m_kind == OpndKindIndir) {
    pIVar3 = AsIndirOpnd(this);
    pRVar2 = pIVar3->m_baseOpnd;
    if ((pRVar2 != (RegOpnd *)0x0) && (pRVar2->m_sym == pSVar1)) {
      return pRVar2;
    }
    pRVar2 = pIVar3->m_indexOpnd;
    if ((pRVar2 != (RegOpnd *)0x0) && (pRVar2->m_sym == pSVar1)) {
      return pRVar2;
    }
  }
  else if ((this->m_kind == OpndKindReg) && (pRVar2 = AsRegOpnd(this), pRVar2->m_sym == pSVar1)) {
    pRVar2 = AsRegOpnd(this);
    return pRVar2;
  }
  return (RegOpnd *)0x0;
}

Assistant:

IR::RegOpnd *
Opnd::FindRegUse(IR::RegOpnd *regOpnd)
{
    StackSym *regSym = regOpnd->m_sym;

    if (this->IsRegOpnd())
    {
        if (this->AsRegOpnd()->m_sym == regSym)
        {
            return this->AsRegOpnd();
        }
    }
    else if (this->IsIndirOpnd())
    {
        IndirOpnd *indirOpnd = this->AsIndirOpnd();
        if (indirOpnd->GetBaseOpnd() && indirOpnd->GetBaseOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetBaseOpnd();
        }
        if (indirOpnd->GetIndexOpnd() && indirOpnd->GetIndexOpnd()->m_sym == regSym)
        {
            return indirOpnd->GetIndexOpnd();
        }
    }

    return nullptr;
}